

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O3

_Bool vma_has_flag(unsigned_long vm_start,char *flag)

{
  long lVar1;
  FILE *__stream;
  byte *pbVar2;
  void *ptr;
  uint in_ECX;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  ulong extraout_RDX;
  char *pcVar6;
  size_t size;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  ulong in_R8;
  _Bool _Var10;
  char cVar11;
  byte local_448;
  undefined7 uStack_447;
  char buf [1024];
  undefined8 local_40;
  unsigned_long end;
  unsigned_long start;
  
  end = 0;
  local_40 = 0;
  pcVar7 = "/proc/self/smaps";
  pcVar6 = "r";
  __stream = fopen("/proc/self/smaps","r");
  if (__stream == (FILE *)0x0) {
    vma_has_flag_cold_1();
    uVar5 = (uint)in_R8;
    uVar8 = 0x10000;
    if (0x10000 < in_ECX) {
      uVar8 = (ulong)in_ECX;
    }
    lVar1 = 0x3f;
    if (uVar8 - 1 != 0) {
      for (; uVar8 - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar9 = 1L << (-((byte)lVar1 ^ 0x3f) & 0x3f);
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    *(int *)(pcVar7 + 0x28) = (int)uVar9;
    *(char **)(pcVar7 + 0x20) = pcVar6;
    uVar8 = (ulong)*(uint *)(pcVar6 + 4) << 10;
    if (extraout_RDX <= uVar8) {
      uVar8 = extraout_RDX;
    }
    uVar9 = uVar9 & 0xffffffff;
    uVar8 = -uVar9 & (uVar8 + uVar9) - 1;
    *(ulong *)(pcVar7 + 0x10) = uVar8;
    pcVar7[0x18] = '\0';
    pcVar7[0x19] = '\0';
    pcVar7[0x1a] = '\0';
    pcVar7[0x1b] = '\0';
    pcVar7[0x1c] = '\0';
    pcVar7[0x1d] = '\0';
    pcVar7[0x1e] = '\0';
    pcVar7[0x1f] = '\0';
    if ((int)uVar5 < 0) {
      if ((~uVar5 & 0x80000002) != 0 && (~uVar5 & 0x80000001) != 0) {
        __assert_fail("IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_PRIVATE) || IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_SHARED)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                      ,0xad,"void slab_arena_flags_init(struct slab_arena *, int)");
      }
      *(uint *)(pcVar7 + 0x2c) = uVar5;
    }
    else {
      if ((in_R8 & 3) == 0) {
        __assert_fail("flags & (MAP_PRIVATE | MAP_SHARED)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                      ,0xa4,"void slab_arena_flags_init(struct slab_arena *, int)");
      }
      if (uVar5 == 2) {
        pcVar7[0x2c] = '\x01';
        pcVar7[0x2d] = '\0';
        pcVar7[0x2e] = '\0';
        pcVar7[0x2f] = -0x80;
        uVar5 = 0x80000001;
      }
      else {
        pcVar7[0x2c] = '\x02';
        pcVar7[0x2d] = '\0';
        pcVar7[0x2e] = '\0';
        pcVar7[0x2f] = -0x80;
        uVar5 = 0x80000002;
      }
    }
    cVar11 = '\0';
    if (uVar8 == 0) {
      size = 0;
      ptr = (void *)0x0;
    }
    else {
      ptr = mmap_checked(uVar8,uVar9,uVar5);
      size = *(size_t *)(pcVar7 + 0x10);
      uVar5 = *(uint *)(pcVar7 + 0x2c);
    }
    *(void **)(pcVar7 + 8) = ptr;
    madvise_checked(ptr,size,uVar5);
    if (*(long *)(pcVar7 + 0x10) != 0) {
      cVar11 = -(*(long *)(pcVar7 + 8) == 0);
    }
    return (_Bool)cVar11;
  }
  pcVar6 = fgets((char *)&local_448,0x400,__stream);
  if (pcVar6 != (char *)0x0) {
    do {
      if (local_448 != 0) {
        pbVar2 = (byte *)&uStack_447;
        pbVar3 = (byte *)&uStack_447;
        bVar4 = local_448;
        do {
          pbVar2 = pbVar2 + 1;
          if (9 < (byte)(bVar4 - 0x30)) {
            uVar5 = bVar4 - 0x2d;
            if (0x39 < uVar5) break;
            if ((0x3f0000003f00000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
              if ((ulong)uVar5 == 0) {
                bVar4 = *pbVar3;
                goto LAB_00101cdc;
              }
              break;
            }
          }
          bVar4 = *pbVar3;
          pbVar3 = pbVar3 + 1;
        } while (bVar4 != 0);
      }
LAB_00101c9b:
      if ((buf[0] == ' ' && CONCAT71(uStack_447,local_448) == 0x3a7367616c466d56) &&
         (end == vm_start)) {
        pcVar6 = strtok((char *)&local_448," \n");
        if (pcVar6 != (char *)0x0) goto LAB_00101d49;
        break;
      }
LAB_00101cbb:
      pcVar6 = fgets((char *)&local_448,0x400,__stream);
    } while (pcVar6 != (char *)0x0);
  }
  _Var10 = false;
  goto LAB_00101d71;
LAB_00101cdc:
  if (bVar4 == 0) goto LAB_00101c9b;
  if ((9 < (byte)(bVar4 - 0x30)) &&
     ((0x25 < bVar4 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar4 - 0x41) & 0x3f) & 1) == 0)))) {
    if (bVar4 == 0x20) {
      __isoc99_sscanf(&local_448,"%lx-%lx",&end,&local_40);
      goto LAB_00101cbb;
    }
    goto LAB_00101c9b;
  }
  bVar4 = *pbVar2;
  pbVar2 = pbVar2 + 1;
  goto LAB_00101cdc;
  while( true ) {
    _Var10 = false;
    pcVar6 = strtok((char *)0x0," \n");
    if (pcVar6 == (char *)0x0) break;
LAB_00101d49:
    if (((*pcVar6 == 'd') && (pcVar6[1] == 'd')) && (pcVar6[2] == '\0')) {
      _Var10 = true;
      break;
    }
  }
LAB_00101d71:
  fclose(__stream);
  return _Var10;
}

Assistant:

static bool
vma_has_flag(unsigned long vm_start, const char *flag)
{
	unsigned long start = 0, end = 0;
	char buf[1024], *tok = NULL;
	bool found = false;
	FILE *f = NULL;

	f = fopen("/proc/self/smaps", "r");
	fail_unless(f != NULL);

	while (fgets(buf, sizeof(buf), f)) {
		if (is_vma_range_fmt(buf, &start, &end))
			continue;
		if (strncmp(buf, "VmFlags: ", 9) || start != vm_start)
			continue;
		tok = buf;
		break;
	}

	if (tok) {
		for (tok = strtok(tok, " \n"); tok;
		     tok = strtok(NULL, " \n")) {
			if (strcmp(tok, flag))
				continue;
			found = true;
			break;
		}
	}

	fclose(f);
	return found;
}